

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactiveDevice.cpp
# Opt level: O0

void __thiscall
Apple::ADB::ReactiveDevice::ReactiveDevice(ReactiveDevice *this,Bus *bus,uint8_t adb_device_id)

{
  size_t sVar1;
  uint8_t adb_device_id_local;
  Bus *bus_local;
  ReactiveDevice *this_local;
  
  Bus::Device::Device(&this->super_Device);
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_adb_bus_did_observe_event_00c99270;
  this->bus_ = bus;
  sVar1 = Bus::add_device(bus,&this->super_Device);
  this->device_id_ = sVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->response_);
  this->bit_offset_ = 0;
  this->microseconds_at_bit_ = 0.0;
  this->phase_ = AwaitingAttention;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->content_);
  this->expected_content_size_ = 0;
  Command::Command(&this->command_);
  this->stop_has_begin_ = false;
  this->default_adb_device_id_ = adb_device_id;
  std::atomic<bool>::atomic(&this->service_desired_,false);
  reset(this);
  return;
}

Assistant:

ReactiveDevice::ReactiveDevice(Apple::ADB::Bus &bus, uint8_t adb_device_id) :
	bus_(bus),
	device_id_(bus.add_device(this)),
	default_adb_device_id_(adb_device_id) {
	reset();
}